

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fct_xchk_fn(int is_pass,char *format,...)

{
  size_t sVar1;
  int iVar2;
  char *src;
  char in_AL;
  char *dst;
  undefined8 *puVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  fct_test_t *list;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t idx;
  fct_nlist_t *list_00;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  src = fct_xchk_file;
  iVar2 = fct_xchk_lineno;
  args[0].reg_save_area = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x10;
  args[0].fp_offset = 0x30;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (fct_xchk_file == (char *)0x0) {
    __assert_fail("file != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x36c
                  ,
                  "fctchk_t *fctchk_new(int, const char *, const char *, int, const char *, struct __va_list_tag *)"
                 );
  }
  if (fct_xchk_lineno < 1) {
    __assert_fail("lineno > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x36d
                  ,
                  "fctchk_t *fctchk_new(int, const char *, const char *, int, const char *, struct __va_list_tag *)"
                 );
  }
  dst = (char *)calloc(1,0x308);
  if (dst == (char *)0x0) {
    fctkern__log_warn(fct_xchk_kern,"out of memory (aborting test)");
  }
  else {
    fctstr_safe_cpy(dst,"<none-from-xchk>",0x100);
    fctstr_safe_cpy(dst + 0x100,src,0x100);
    *(int *)(dst + 0x200) = iVar2;
    *(int *)(dst + 0x204) = is_pass;
    if (format == (char *)0x0) {
      fctstr_safe_cpy(dst + 0x208,"<none-from-xchk>",0x100);
    }
    else {
      vsnprintf(dst + 0x208,0x100,format,args);
    }
    if (fct_xchk_test == (fct_test_t *)0x0) {
      __assert_fail("test != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                    0x40a,"void fct_test__add(fct_test_t *, fctchk_t *)");
    }
    list = (fct_test_t *)&fct_xchk_test->passed_chks;
    if (*(int *)(dst + 0x204) == 0) {
      list = fct_xchk_test;
    }
    fct_nlist__append(&list->failed_chks,dst);
    if (fct_xchk_kern == (fctkern_t *)0x0) {
      __assert_fail("nk != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                    0x94b,"void fctkern__log_chk(fctkern_t *, const fctchk_t *)");
    }
    sVar1 = (fct_xchk_kern->logger_list).used_itm_num;
    list_00 = &fct_xchk_kern->logger_list;
    for (idx = 0; sVar1 != idx; idx = idx + 1) {
      puVar3 = (undefined8 *)fct_nlist__at(list_00,idx);
      puVar3[0xc] = dst;
      (*(code *)*puVar3)(puVar3,puVar3 + 0xb);
    }
  }
  fct_xchk_lineno = 0;
  fct_xchk_file = (char *)0x0;
  fct_xchk_test = (fct_test_t *)0x0;
  fct_xchk_kern = (fctkern_t *)0x0;
  return is_pass;
}

Assistant:

static int
fct_xchk_fn(int is_pass, char const *format, ...)
{
    int r=0;
    va_list args;
    va_start(args, format);
    r = _fct_xchk_fn_varg("<none-from-xchk>", is_pass, format, args);
    va_end(args);
    return r;
}